

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkSopEsopCover(Abc_Ntk_t *pNtk,int nFaninMax,int nCubesMax,int fUseEsop,int fUseSop,
                   int fUseInvs,int fVerbose)

{
  uint *puVar1;
  byte *pbVar2;
  long *plVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  Cov_Man_t *p;
  Vec_Int_t *pVVar9;
  Abc_Obj_t *pAVar10;
  Vec_Ptr_t *vBoundary;
  void **ppvVar11;
  ProgressBar *p_00;
  Vec_Ptr_t *pVVar12;
  Abc_Ntk_t *pNtk_00;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  timespec ts;
  timespec local_68;
  long local_58;
  long local_50;
  Cov_Man_t *local_48;
  Abc_Ntk_t *local_40;
  ulong local_38;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covCore.c"
                  ,0x41,"Abc_Ntk_t *Abc_NtkSopEsopCover(Abc_Ntk_t *, int, int, int, int, int, int)")
    ;
  }
  p = Cov_ManAlloc(pNtk,nFaninMax,nCubesMax);
  p->fUseEsop = fUseEsop;
  p->fUseSop = fUseSop;
  pNtk->pManCut = p;
  iVar7 = clock_gettime(3,&local_68);
  if (iVar7 < 0) {
    local_58 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    local_58 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  pVVar9 = Abc_NtkFanoutCounts(pNtk);
  p->vFanCounts = pVVar9;
  pAVar10 = Abc_AigConst1(pNtk);
  pAVar10->field_0x14 = pAVar10->field_0x14 | 0x10;
  pVVar12 = pNtk->vCis;
  if (0 < pVVar12->nSize) {
    lVar13 = 0;
    do {
      puVar1 = (uint *)((long)pVVar12->pArray[lVar13] + 0x14);
      *puVar1 = *puVar1 | 0x10;
      lVar13 = lVar13 + 1;
      pVVar12 = pNtk->vCis;
    } while (lVar13 < pVVar12->nSize);
  }
  uVar14 = 0;
  local_48 = p;
  local_40 = pNtk;
  do {
    if (fVerbose != 0) {
      printf("Iter %d : ",(ulong)((int)uVar14 + 1));
    }
    iVar7 = clock_gettime(3,&local_68);
    if (iVar7 < 0) {
      local_50 = 1;
    }
    else {
      lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
      local_50 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_68.tv_sec * -1000000;
    }
    local_38 = uVar14;
    vBoundary = (Vec_Ptr_t *)malloc(0x10);
    vBoundary->nCap = 100;
    vBoundary->nSize = 0;
    ppvVar11 = (void **)malloc(800);
    vBoundary->pArray = ppvVar11;
    p_00 = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
    pVVar12 = pNtk->vCos;
    if (pVVar12->nSize < 1) {
      uVar14 = 0;
      bVar5 = false;
    }
    else {
      lVar13 = 0;
      bVar5 = true;
      uVar14 = 0;
      do {
        plVar3 = (long *)pVVar12->pArray[lVar13];
        if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar13)) {
          Extra_ProgressBarUpdate_int(p_00,(int)lVar13,(char *)0x0);
        }
        pAVar10 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        if ((pAVar10->field_0x14 & 0x10) == 0) {
          iVar7 = pAVar10->Id;
          if (((long)iVar7 < 0) ||
             (lVar4 = *(long *)((long)pAVar10->pNtk->pManCut + 0x18), *(int *)(lVar4 + 4) <= iVar7))
          {
LAB_00448b81:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (*(long *)(*(long *)(*(long *)(lVar4 + 8) + (long)iVar7 * 8) + 0x18) == 0) {
            Abc_NtkCovCovers_rec(local_48,pAVar10,vBoundary);
          }
          iVar7 = pAVar10->Id;
          if (((long)iVar7 < 0) ||
             (lVar4 = *(long *)((long)pAVar10->pNtk->pManCut + 0x18), *(int *)(lVar4 + 4) <= iVar7))
          goto LAB_00448b81;
          bVar16 = *(long *)(*(long *)(*(long *)(lVar4 + 8) + (long)iVar7 * 8) + 0x18) != 0;
          if (!bVar16) {
            bVar5 = false;
          }
          uVar15 = (int)uVar14 + (uint)bVar16;
        }
        else {
          uVar15 = (int)uVar14 + 1;
        }
        uVar14 = (ulong)uVar15;
        lVar13 = lVar13 + 1;
        pVVar12 = local_40->vCos;
      } while (lVar13 < pVVar12->nSize);
      bVar5 = !bVar5;
      pNtk = local_40;
      p = local_48;
    }
    Extra_ProgressBarStop(p_00);
    uVar6 = local_38;
    pVVar12 = pNtk->vObjs;
    if (0 < pVVar12->nSize) {
      lVar13 = 0;
      do {
        if (pVVar12->pArray[lVar13] != (void *)0x0) {
          pbVar2 = (byte *)((long)pVVar12->pArray[lVar13] + 0x14);
          *pbVar2 = *pbVar2 & 0xdf;
        }
        lVar13 = lVar13 + 1;
        pVVar12 = pNtk->vObjs;
      } while (lVar13 < pVVar12->nSize);
    }
    p->nBoundary = 0;
    if (0 < vBoundary->nSize) {
      lVar13 = 0;
      do {
        uVar15 = *(uint *)((long)vBoundary->pArray[lVar13] + 0x14);
        if ((uVar15 & 0x10) == 0) {
          *(uint *)((long)vBoundary->pArray[lVar13] + 0x14) = uVar15 | 0x10;
          p->nBoundary = p->nBoundary + 1;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < vBoundary->nSize);
    }
    if (vBoundary->pArray != (void **)0x0) {
      free(vBoundary->pArray);
      vBoundary->pArray = (void **)0x0;
    }
    free(vBoundary);
    iVar7 = (int)vBoundary;
    if (fVerbose != 0) {
      iVar7 = 0x9b5b5e;
      printf("Outs = %4d (%4d) Node = %6d (%6d) Max = %6d  Bound = %4d  ",uVar14,
             (ulong)(uint)pNtk->vCos->nSize,(ulong)(uint)p->nSupps,(ulong)(uint)pNtk->nObjCounts[7],
             (ulong)(uint)p->nSuppsMax,p->nBoundary);
      Abc_Print(iVar7,"%s =","T");
      iVar7 = 3;
      iVar8 = clock_gettime(3,&local_68);
      if (iVar8 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar13 + local_50) / 1000000.0);
    }
    uVar14 = (ulong)((int)uVar6 + 1);
    if (!bVar5) {
      pVVar12 = pNtk->vObjs;
      if (0 < pVVar12->nSize) {
        lVar13 = 0;
        do {
          if (pVVar12->pArray[lVar13] != (void *)0x0) {
            pbVar2 = (byte *)((long)pVVar12->pArray[lVar13] + 0x14);
            *pbVar2 = *pbVar2 & 0xef;
          }
          lVar13 = lVar13 + 1;
          pVVar12 = pNtk->vObjs;
        } while (lVar13 < pVVar12->nSize);
      }
      if (fVerbose != 0) {
        Abc_Print(iVar7,"%s =","Total");
        iVar8 = 3;
        iVar7 = clock_gettime(3,&local_68);
        if (iVar7 < 0) {
          lVar13 = -1;
        }
        else {
          lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
        }
        Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar13 + local_58) / 1000000.0);
      }
      pNtk_00 = Abc_NtkCovDeriveRegular(p,pNtk);
      Cov_ManFree(p);
      pNtk->pManCut = (void *)0x0;
      if (pNtk_00 != (Abc_Ntk_t *)0x0) {
        iVar7 = Abc_NtkCheck(pNtk_00);
        if (iVar7 == 0) {
          puts("Abc_NtkCov: The network check has failed.");
          Abc_NtkDelete(pNtk_00);
          pNtk_00 = (Abc_Ntk_t *)0x0;
        }
      }
      return pNtk_00;
    }
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkSopEsopCover( Abc_Ntk_t * pNtk, int nFaninMax, int nCubesMax, int fUseEsop, int fUseSop, int fUseInvs, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Cov_Man_t * p;

    assert( Abc_NtkIsStrash(pNtk) );

    // create the manager
    p = Cov_ManAlloc( pNtk, nFaninMax, nCubesMax );
    p->fUseEsop = fUseEsop;
    p->fUseSop  = fUseSop;
    pNtk->pManCut = p;

    // perform mapping
    Abc_NtkCovCovers( p, pNtk, fVerbose );

    // derive the final network
//    if ( fUseInvs )
//        pNtkNew = Abc_NtkCovDeriveClean( p, pNtk );
//      else
//       pNtkNew = Abc_NtkCovDerive( p, pNtk );
//    pNtkNew = NULL;
    pNtkNew = Abc_NtkCovDeriveRegular( p, pNtk );

    Cov_ManFree( p );
    pNtk->pManCut = NULL;

    // make sure that everything is okay
    if ( pNtkNew && !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCov: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}